

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_logical_operator.cpp
# Opt level: O1

void __thiscall
duckdb::LogicalRecursiveCTE::Serialize(LogicalRecursiveCTE *this,Serializer *serializer)

{
  LogicalOperator::Serialize(&this->super_LogicalOperator,serializer);
  Serializer::WritePropertyWithDefault<bool>
            (serializer,200,"union_all",(bool *)&(this->super_LogicalOperator).field_0x61);
  Serializer::WritePropertyWithDefault<std::__cxx11::string>
            (serializer,0xc9,"ctename",&this->ctename);
  Serializer::WritePropertyWithDefault<unsigned_long>
            (serializer,0xca,"table_index",&this->table_index);
  Serializer::WritePropertyWithDefault<unsigned_long>
            (serializer,0xcb,"column_count",&this->column_count);
  Serializer::
  WritePropertyWithDefault<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>>
            (serializer,0xcc,"key_targets",&this->key_targets);
  Serializer::WritePropertyWithDefault<bool>
            (serializer,0xcd,"ref_recurring",(bool *)&(this->super_LogicalOperator).field_0x62);
  return;
}

Assistant:

void LogicalRecursiveCTE::Serialize(Serializer &serializer) const {
	LogicalOperator::Serialize(serializer);
	serializer.WritePropertyWithDefault<bool>(200, "union_all", union_all);
	serializer.WritePropertyWithDefault<string>(201, "ctename", ctename);
	serializer.WritePropertyWithDefault<idx_t>(202, "table_index", table_index);
	serializer.WritePropertyWithDefault<idx_t>(203, "column_count", column_count);
	serializer.WritePropertyWithDefault<vector<unique_ptr<Expression>>>(204, "key_targets", key_targets);
	serializer.WritePropertyWithDefault<bool>(205, "ref_recurring", ref_recurring);
}